

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

matches * atomvec(disctx *ctx,ull *a,ull *m,void *v,int spos)

{
  int *piVar1;
  long lVar2;
  match *pmVar3;
  int iVar4;
  expr *peVar5;
  ull uVar6;
  ull uVar7;
  expr *peVar8;
  char *pcVar9;
  expr **ppeVar10;
  void *pvVar11;
  bitfield *bf;
  size_t sVar12;
  match *pmVar13;
  undefined8 *in_RCX;
  long in_RDI;
  int in_R8D;
  matches *rres;
  ull num;
  char *end;
  expr *e;
  int i_1;
  ull cur;
  ull mask_1;
  ull cnt_1;
  ull start;
  expr *expr_1;
  match res;
  expr *sexpr_1;
  expr *sexpr;
  int i;
  int k;
  ull mask;
  ull cnt;
  ull base;
  expr *expr;
  vec *vec;
  undefined8 in_stack_fffffffffffffe70;
  etype type;
  disctx *in_stack_fffffffffffffe78;
  ull *in_stack_fffffffffffffe80;
  char *__s2;
  ull *in_stack_fffffffffffffe88;
  bitfield *in_stack_fffffffffffffe90;
  char *local_168;
  int *local_160;
  int local_154;
  match *local_150;
  ulong num_00;
  match *pmVar14;
  match *pmVar15;
  undefined1 local_128 [40];
  int local_100;
  int local_60;
  int local_5c;
  ulong local_58;
  matches *local_8;
  
  if (*(int *)(in_RDI + 0x48) == 0) {
    type = (etype)((ulong)in_stack_fffffffffffffe70 >> 0x20);
    peVar5 = makeex(type);
    uVar6 = getbf(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                  in_stack_fffffffffffffe78);
    uVar7 = getbf(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                  in_stack_fffffffffffffe78);
    local_58 = 0xffffffffffffffff;
    if (in_RCX[3] != 0) {
      local_58 = getbf(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80
                       ,in_stack_fffffffffffffe78);
    }
    local_5c = 0;
    for (local_60 = 0; (ulong)(long)local_60 < uVar7; local_60 = local_60 + 1) {
      if ((local_58 & 1L << ((byte)local_60 & 0x3f)) == 0) {
        peVar8 = makeex(type);
        if (peVar5->vexprsmax <= peVar5->vexprsnum) {
          if (peVar5->vexprsmax == 0) {
            peVar5->vexprsmax = 0x10;
          }
          else {
            peVar5->vexprsmax = peVar5->vexprsmax << 1;
          }
          ppeVar10 = (expr **)realloc(peVar5->vexprs,(long)peVar5->vexprsmax << 3);
          peVar5->vexprs = ppeVar10;
        }
        iVar4 = peVar5->vexprsnum;
        peVar5->vexprsnum = iVar4 + 1;
        peVar5->vexprs[iVar4] = peVar8;
      }
      else {
        peVar8 = makeex(type);
        peVar8->special = *(int *)(in_RCX + 4);
        pcVar9 = aprint("%s%lld",*in_RCX,uVar6 + (long)local_5c);
        peVar8->str = pcVar9;
        if (peVar5->vexprsmax <= peVar5->vexprsnum) {
          if (peVar5->vexprsmax == 0) {
            peVar5->vexprsmax = 0x10;
          }
          else {
            peVar5->vexprsmax = peVar5->vexprsmax << 1;
          }
          ppeVar10 = (expr **)realloc(peVar5->vexprs,(long)peVar5->vexprsmax << 3);
          peVar5->vexprs = ppeVar10;
        }
        iVar4 = peVar5->vexprsnum;
        peVar5->vexprsnum = iVar4 + 1;
        peVar5->vexprs[iVar4] = peVar8;
        local_5c = local_5c + 1;
      }
    }
    if (*(int *)(in_RDI + 0x74) <= *(int *)(in_RDI + 0x70)) {
      if (*(int *)(in_RDI + 0x74) == 0) {
        *(undefined4 *)(in_RDI + 0x74) = 0x10;
      }
      else {
        *(int *)(in_RDI + 0x74) = *(int *)(in_RDI + 0x74) << 1;
      }
      pvVar11 = realloc(*(void **)(in_RDI + 0x68),(long)*(int *)(in_RDI + 0x74) << 3);
      *(void **)(in_RDI + 0x68) = pvVar11;
    }
    iVar4 = *(int *)(in_RDI + 0x70);
    *(int *)(in_RDI + 0x70) = iVar4 + 1;
    *(expr **)(*(long *)(in_RDI + 0x68) + (long)iVar4 * 8) = peVar5;
    local_8 = (matches *)0x0;
  }
  else if (in_R8D == *(int *)(*(long *)(in_RDI + 0x50) + 0x18)) {
    local_8 = (matches *)0x0;
  }
  else {
    memset(local_128,0,0xb8);
    local_100 = in_R8D + 1;
    piVar1 = *(int **)(*(long *)(*(long *)(in_RDI + 0x50) + 0x10) + (long)in_R8D * 8);
    if (*piVar1 == 5) {
      pmVar14 = (match *)0x0;
      bf = (bitfield *)(long)piVar1[0xe];
      num_00 = 0;
      local_150 = (match *)0x0;
      for (local_154 = 0; (bitfield *)(long)local_154 < bf; local_154 = local_154 + 1) {
        local_160 = *(int **)(*(long *)(piVar1 + 0xc) + (long)local_154 * 8);
        if (*local_160 != 6) {
          if (*local_160 != 3) {
            return (matches *)0x0;
          }
          pcVar9 = *(char **)(local_160 + 2);
          __s2 = (char *)*in_RCX;
          sVar12 = strlen((char *)*in_RCX);
          iVar4 = strncmp(pcVar9,__s2,sVar12);
          if (iVar4 != 0) {
            return (matches *)0x0;
          }
          lVar2 = *(long *)(local_160 + 2);
          sVar12 = strlen((char *)*in_RCX);
          pmVar13 = (match *)strtoull((char *)(lVar2 + sVar12),&local_168,10);
          if (*local_168 != '\0') {
            return (matches *)0x0;
          }
          pmVar15 = pmVar13;
          pmVar3 = pmVar13;
          if ((num_00 != 0) && (pmVar15 = pmVar14, pmVar3 = local_150, pmVar13 != local_150)) {
            return (matches *)0x0;
          }
          local_150 = (match *)((long)&pmVar3->oplen + 1);
          num_00 = 1L << ((byte)local_154 & 0x3f) | num_00;
          pmVar14 = pmVar15;
        }
      }
      iVar4 = setbf(pmVar14,bf,num_00);
      if (iVar4 == 0) {
        local_8 = (matches *)0x0;
      }
      else {
        iVar4 = setbf(pmVar14,bf,num_00);
        if (iVar4 == 0) {
          local_8 = (matches *)0x0;
        }
        else {
          if (in_RCX[3] == 0) {
            if (num_00 != (1L << ((byte)bf & 0x3f)) - 1U) {
              return (matches *)0x0;
            }
          }
          else {
            iVar4 = setbf(pmVar14,bf,num_00);
            if (iVar4 == 0) {
              return (matches *)0x0;
            }
          }
          local_8 = emptymatches();
          if (local_8->mmax <= local_8->mnum) {
            if (local_8->mmax == 0) {
              local_8->mmax = 0x10;
            }
            else {
              local_8->mmax = local_8->mmax << 1;
            }
            pmVar14 = (match *)realloc(local_8->m,(long)local_8->mmax * 0xb8);
            local_8->m = pmVar14;
          }
          iVar4 = local_8->mnum;
          local_8->mnum = iVar4 + 1;
          memcpy(local_8->m + iVar4,local_128,0xb8);
        }
      }
    }
    else {
      local_8 = (matches *)0x0;
    }
  }
  return local_8;
}

Assistant:

struct matches *atomvec APROTO {
	const struct vec *vec = v;
	if (!ctx->reverse) {
		struct expr *expr = makeex(EXPR_VEC);
		ull base = GETBF(vec->bf);
		ull cnt = GETBF(vec->cnt);
		ull mask = -1ull;
		if (vec->mask)
			mask = GETBF(vec->mask);
		int k = 0, i;
		for (i = 0; i < cnt; i++) {
			if (mask & 1ull<<i) {
				struct expr *sexpr = makeex(EXPR_REG);
				sexpr->special = vec->cool;
				sexpr->str = aprint("%s%lld", vec->name,  base + k++);
				ADDARRAY(expr->vexprs, sexpr);
			} else {
				struct expr *sexpr = makeex(EXPR_DISCARD);
				ADDARRAY(expr->vexprs, sexpr);
			}
		}
		ADDARRAY(ctx->atoms, expr);
		return NULL;
	} else {
		if (spos == ctx->line->atomsnum)
			return 0;
		struct match res = { 0, .lpos = spos+1 };
		const struct expr *expr = ctx->line->atoms[spos];
		if (expr->type != EXPR_VEC)
			return 0;
		ull start = 0, cnt = expr->vexprsnum, mask = 0, cur = 0;
		int i;
		for (i = 0; i < cnt; i++) {
			const struct expr *e = expr->vexprs[i];
			if (e->type == EXPR_DISCARD) {
			} else if (e->type == EXPR_REG) {
				if (strncmp(e->str, vec->name, strlen(vec->name)))
					return 0;
				char *end;
				ull num = strtoull(e->str + strlen(vec->name), &end, 10);
				if (*end)
					return 0;
				if (mask) {
					if (num != cur)
						return 0;
					cur++;
				} else {
					start = num;
					cur = num + 1;
				}
				mask |= 1ull << i;
			} else {
				return 0;
			}
		}
		if (!setbf(&res, vec->bf, start))
			return 0;
		if (!setbf(&res, vec->cnt, cnt))
			return 0;
		if (vec->mask) {
			if (!setbf(&res, vec->mask, mask))
				return 0;
		} else {
			if (mask != (1ull << cnt) - 1)
			       return 0;	
		}
		struct matches *rres = emptymatches();
		ADDARRAY(rres->m, res);
		return rres;
	}
}